

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O0

void __thiscall helics::TimeoutMonitor::tick(TimeoutMonitor *this,CommonCore *core)

{
  bool bVar1;
  BrokerState BVar2;
  undefined8 uVar3;
  CommonCore *in_RSI;
  long in_RDI;
  ActionMessage png_3;
  time_point now_2;
  ActionMessage png_2;
  time_point now_1;
  ActionMessage rsend;
  ActionMessage png_1;
  ActionMessage png;
  string message;
  time_point now;
  ActionMessage *in_stack_fffffffffffffa08;
  ActionMessage *pAVar4;
  CommonCore *in_stack_fffffffffffffa10;
  BrokerBase *this_00;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa28;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffa30;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffa38;
  undefined1 *puVar5;
  allocator<char> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  GlobalFederateId local_584 [3];
  BaseType local_578;
  int in_stack_fffffffffffffaec;
  CommonCore *in_stack_fffffffffffffaf0;
  string_view in_stack_fffffffffffffaf8;
  __unspec local_4c1;
  rep local_4c0;
  type local_4b1;
  undefined8 local_4b0;
  BaseType local_4a0;
  GlobalFederateId local_49c;
  undefined1 in_stack_fffffffffffffb6b;
  int in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  string_view in_stack_fffffffffffffb78;
  GlobalFederateId in_stack_fffffffffffffb8c;
  __unspec local_3d9;
  rep local_3d8;
  type local_3c9;
  undefined8 local_3c8;
  undefined1 local_3c0 [4];
  undefined4 local_3bc;
  action_t in_stack_fffffffffffffc7c;
  CommonCore *in_stack_fffffffffffffc80;
  string_view in_stack_fffffffffffffcb0;
  GlobalFederateId local_2ec;
  BaseType local_2e8;
  GlobalFederateId local_2e4;
  ActionMessage local_2e0;
  undefined4 local_228;
  undefined4 local_224;
  BaseType local_220;
  GlobalFederateId local_21c;
  BaseType local_218;
  GlobalFederateId local_214;
  undefined1 local_210 [8];
  BaseType local_208;
  BaseType local_200;
  __sv_type local_a0;
  __sv_type local_90;
  __sv_type local_80;
  BaseType local_6c;
  GlobalFederateId local_68 [5];
  allocator<char> local_51 [40];
  __unspec local_29;
  rep local_28;
  type local_19;
  undefined8 local_18;
  CommonCore *local_10;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    bVar1 = CommonCore::isConnected(in_stack_fffffffffffffa10);
    if ((bVar1) &&
       (bVar1 = GlobalBrokerId::isValid(&(local_10->super_BrokerBase).global_broker_id_local), bVar1
       )) {
      local_228 = 0;
      bVar1 = GlobalBrokerId::operator!=
                        (&(local_10->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0);
      if (bVar1) {
        bVar1 = GlobalBrokerId::isValid(&(local_10->super_BrokerBase).higher_broker_id);
        if (!bVar1) {
          return;
        }
        pAVar4 = &local_2e0;
        ActionMessage::ActionMessage(pAVar4,startingAction);
        local_2e8 = (local_10->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(&local_2e4,(GlobalBrokerId)local_2e8);
        local_2e0.source_id.gid = local_2e4.gid;
        GlobalFederateId::GlobalFederateId
                  (&local_2ec,(GlobalBrokerId)(local_10->super_BrokerBase).higher_broker_id.gid);
        local_2e0.dest_id.gid = local_2ec.gid;
        (*(local_10->super_Core)._vptr_Core[0x6b])(local_10,0,pAVar4);
        uVar3 = std::chrono::_V2::steady_clock::now();
        *(undefined8 *)(in_RDI + 0x20) = uVar3;
        *(undefined1 *)(in_RDI + 0x18) = 1;
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa10);
        return;
      }
    }
    bVar1 = CommonCore::isConnected(in_stack_fffffffffffffa10);
    if ((!bVar1) ||
       ((bVar1 = GlobalBrokerId::isValid(&(local_10->super_BrokerBase).global_broker_id_local),
        bVar1 && (bVar1 = GlobalBrokerId::operator==
                                    (&(local_10->super_BrokerBase).global_broker_id_local,
                                     (GlobalBrokerId)0x0), !bVar1)))) {
      BVar2 = std::atomic::operator_cast_to_BrokerState
                        ((atomic<helics::BrokerBase::BrokerState> *)0x65b635);
      if ((BVar2 == TERMINATED) ||
         (BVar2 = std::atomic::operator_cast_to_BrokerState
                            ((atomic<helics::BrokerBase::BrokerState> *)0x65b653), BVar2 == ERRORED)
         ) {
        if ((*(byte *)(in_RDI + 8) & 1) == 0) {
          *(undefined1 *)(in_RDI + 8) = 1;
          uVar3 = std::chrono::_V2::steady_clock::now();
          *(undefined8 *)(in_RDI + 0x10) = uVar3;
        }
        else {
          local_3c8 = std::chrono::_V2::steady_clock::now();
          local_3d8 = (rep)std::chrono::operator-
                                     (in_stack_fffffffffffffa18,
                                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)in_stack_fffffffffffffa10);
          local_3c9 = (type)std::chrono::
                            operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                      (in_stack_fffffffffffffa38,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       in_stack_fffffffffffffa30);
          CLI::std::__cmp_cat::__unspec::__unspec(&local_3d9,(__unspec *)0x0);
          bVar1 = CLI::std::operator>(local_3c9);
          if (bVar1) {
            ActionMessage::ActionMessage(in_stack_fffffffffffffa30,startingAction);
            local_4a0 = (local_10->super_BrokerBase).global_broker_id_local.gid;
            GlobalFederateId::GlobalFederateId(&local_49c,(GlobalBrokerId)local_4a0);
            BrokerBase::addActionMessage
                      ((BrokerBase *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa10);
          }
        }
      }
      else if ((*(byte *)(in_RDI + 8) & 1) == 0) {
        *(undefined1 *)(in_RDI + 8) = 1;
        uVar3 = std::chrono::_V2::steady_clock::now();
        *(undefined8 *)(in_RDI + 0x10) = uVar3;
      }
      else {
        local_4b0 = std::chrono::_V2::steady_clock::now();
        local_4c0 = (rep)std::chrono::operator-
                                   (in_stack_fffffffffffffa18,
                                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)in_stack_fffffffffffffa10);
        local_4b1 = (type)std::chrono::
                          operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                    (in_stack_fffffffffffffa38,
                                     (duration<long,_std::ratio<1L,_1000L>_> *)
                                     in_stack_fffffffffffffa30);
        CLI::std::__cmp_cat::__unspec::__unspec(&local_4c1,(__unspec *)0x0);
        bVar1 = CLI::std::operator>(local_4b1);
        if (bVar1) {
          ActionMessage::ActionMessage(in_stack_fffffffffffffa30,startingAction);
          GlobalFederateId::GlobalFederateId
                    (local_584,
                     (GlobalBrokerId)(local_10->super_BrokerBase).global_broker_id_local.gid);
          local_578 = local_584[0].gid;
          BrokerBase::addActionMessage
                    ((BrokerBase *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa10);
        }
      }
    }
    else {
      ActionMessage::ActionMessage(in_stack_fffffffffffffa30,(action_t)((ulong)local_3c0 >> 0x20));
      local_3bc = 0xefffffd8;
      CommonCore::processCommand
                ((CommonCore *)png_2.payload.buffer._M_elems._8_8_,
                 (ActionMessage *)png_2.payload.buffer._M_elems._0_8_);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa10);
    }
  }
  else {
    local_18 = std::chrono::_V2::steady_clock::now();
    local_28 = (rep)std::chrono::operator-
                              (in_stack_fffffffffffffa18,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)in_stack_fffffffffffffa10);
    local_19 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                               (in_stack_fffffffffffffa38,
                                (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffa30)
    ;
    CLI::std::__cmp_cat::__unspec::__unspec(&local_29,(__unspec *)0x0);
    bVar1 = CLI::std::operator>(local_19);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::allocator<char>::~allocator(local_51);
      local_6c = (local_10->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(local_68,(GlobalBrokerId)local_6c);
      CommonCore::getIdentifier_abi_cxx11_(local_10);
      local_80 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffa10);
      local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffa10);
      pAVar4 = (ActionMessage *)local_90._M_len;
      this_00 = (BrokerBase *)local_90._M_str;
      BrokerBase::sendToLogger
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb8c,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb78,
                 in_stack_fffffffffffffcb0,(bool)in_stack_fffffffffffffb6b);
      local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00);
      CommonCore::sendErrorToFederates
                (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffaf8);
      CLI::std::atomic<helics::BrokerBase::BrokerState>::operator=
                ((atomic<helics::BrokerBase::BrokerState> *)this_00,
                 (BrokerState)((ulong)pAVar4 >> 0x30));
      CommonCore::sendDisconnect(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      ActionMessage::ActionMessage(in_stack_fffffffffffffa30,startingAction);
      BrokerBase::addActionMessage(this_00,pAVar4);
      ActionMessage::~ActionMessage((ActionMessage *)this_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    }
    else {
      puVar5 = local_210;
      ActionMessage::ActionMessage(in_stack_fffffffffffffa30,startingAction);
      local_218 = (local_10->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(&local_214,(GlobalBrokerId)local_218);
      local_208 = local_214.gid;
      local_220 = (local_10->super_BrokerBase).higher_broker_id.gid;
      GlobalFederateId::GlobalFederateId(&local_21c,(GlobalBrokerId)local_220);
      local_200 = local_21c.gid;
      local_224 = 0;
      (*(local_10->super_Core)._vptr_Core[0x6b])(local_10,0,puVar5);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa10);
    }
  }
  return;
}

Assistant:

void TimeoutMonitor::tick(CommonCore* core)
{
    if (parentConnection.waitingForPingReply) {
        auto now = std::chrono::steady_clock::now();
        if (now - parentConnection.lastPing > timeout) {
            // try to reset the connection to the broker
            // brokerReconnect()
            const std::string message{"core lost connection with broker"};
            core->sendToLogger(core->global_broker_id_local,
                               LogLevels::ERROR_LEVEL,
                               core->getIdentifier(),
                               message);
            core->sendErrorToFederates(-5, message);
            core->brokerState = BrokerBase::BrokerState::ERRORED;
            core->sendDisconnect();
            core->addActionMessage(CMD_STOP);
        } else {  // ping again
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = core->global_broker_id_local;
            png.dest_id = core->higher_broker_id;
            core->transmit(parent_route_id, png);
        }
    } else if ((core->isConnected()) && (core->global_broker_id_local.isValid()) &&
               (core->global_broker_id_local != parent_broker_id)) {
        // if (allFedWaiting())
        //{
        if (core->higher_broker_id.isValid()) {
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = core->global_broker_id_local;
            png.dest_id = core->higher_broker_id;
            core->transmit(parent_route_id, png);
            parentConnection.lastPing = std::chrono::steady_clock::now();
            parentConnection.waitingForPingReply = true;
        }
        //}
    } else if ((core->isConnected()) &&
               ((!core->global_broker_id_local.isValid()) ||
                (core->global_broker_id_local == parent_broker_id))) {
        ActionMessage rsend(CMD_RESEND);
        rsend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
        core->processCommand(std::move(rsend));
    } else if ((core->brokerState == BrokerBase::BrokerState::TERMINATED) ||
               (core->brokerState == BrokerBase::BrokerState::ERRORED)) {
        if (waitingForConnection) {
            auto now = std::chrono::steady_clock::now();
            if (now - startWaiting > timeout) {
                ActionMessage png(CMD_CHECK_CONNECTIONS);
                png.source_id = core->global_broker_id_local;
                core->addActionMessage(png);
            }
        } else {
            waitingForConnection = true;
            startWaiting = std::chrono::steady_clock::now();
        }
    } else {
        if (waitingForConnection) {
            auto now = std::chrono::steady_clock::now();
            if (now - startWaiting > timeout) {
                ActionMessage png(CMD_CHECK_CONNECTIONS);
                png.source_id = core->global_broker_id_local;
                core->addActionMessage(png);
            }
        } else {
            waitingForConnection = true;
            startWaiting = std::chrono::steady_clock::now();
        }
    }
}